

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pingpong_test.c
# Opt level: O0

void mutex_cond_unexpired_deadline_ping_pong(ping_pong *pp,int parity)

{
  undefined1 local_28 [8];
  timespec ts;
  int parity_local;
  ping_pong *pp_local;
  
  ts.tv_nsec._4_4_ = parity;
  clock_gettime(0,(timespec *)local_28);
  local_28 = (undefined1  [8])((long)local_28 + 0xe10);
  pthread_mutex_lock((pthread_mutex_t *)&pp->mutex);
  while (pp->i < pp->limit) {
    while ((pp->i & 1U) == ts.tv_nsec._4_4_) {
      pthread_cond_timedwait
                ((pthread_cond_t *)(pp->cond + (int)ts.tv_nsec._4_4_),(pthread_mutex_t *)&pp->mutex,
                 (timespec *)local_28);
    }
    pp->i = pp->i + 1;
    pthread_cond_signal((pthread_cond_t *)(pp->cond + (int)(1 - ts.tv_nsec._4_4_)));
  }
  pthread_mutex_unlock((pthread_mutex_t *)&pp->mutex);
  ping_pong_done(pp);
  return;
}

Assistant:

static void mutex_cond_unexpired_deadline_ping_pong (ping_pong *pp, int parity) {
	struct timespec ts;
	clock_gettime (CLOCK_REALTIME, &ts);
	ts.tv_sec += 3600;
	pthread_mutex_lock (&pp->mutex);
	while (pp->i < pp->limit) {
		while ((pp->i & 1) == parity) {
			pthread_cond_timedwait (&pp->cond[parity], &pp->mutex, &ts);
		}
		pp->i++;
		pthread_cond_signal (&pp->cond[1-parity]);
	}
	pthread_mutex_unlock (&pp->mutex);
	ping_pong_done (pp);
}